

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_resolveComponentWithUnitsMissingModel_Test::TestBody
          (Importer_resolveComponentWithUnitsMissingModel_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  unsigned_long local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  AssertionResult gtest_ar_2;
  ImporterPtr importer;
  ModelPtr model;
  ParserPtr parser;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parser,"importer/",(allocator<char> *)&model);
  resourcePath((string *)&gtest_ar_2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
                 "The attempt to resolve imports with the model at \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::operator+(&e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
                 "missing_model.cellml\' failed: the file could not be opened.");
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&parser);
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_2,
             "importer/importing_component_with_imported_units_missing_model.cellml",
             (allocator<char> *)&importer);
  fileContents((string *)&gtest_ar);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_7_ = 0;
  importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(0)","parser->issueCount()",(unsigned_long *)&gtest_ar_2,
             (unsigned_long *)&importer);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&importer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x32c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&importer,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&importer);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Importer::create(SUB81(&importer,0));
  peVar1 = importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_2,"importer/",(allocator<char> *)&local_98);
  resourcePath((string *)&gtest_ar);
  libcellml::Importer::resolveImports((shared_ptr *)peVar1,(string *)&model);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0;
  local_98 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"size_t(1)","importer->issueCount()",(unsigned_long *)&gtest_ar_2
             ,&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x330,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Logger::issue((ulong)&local_98);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_2,"e","importer->issue(0)->description()",&e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x331,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(Importer, resolveComponentWithUnitsMissingModel)
{
    std::string e = "The attempt to resolve imports with the model at '" + resourcePath("importer/") + "missing_model.cellml' failed: the file could not be opened.";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/importing_component_with_imported_units_missing_model.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(e, importer->issue(0)->description());
}